

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O2

bool __thiscall duckdb::ErrorData::operator==(ErrorData *this,ErrorData *other)

{
  __type _Var1;
  
  if ((this->initialized == other->initialized) && (this->type == other->type)) {
    _Var1 = ::std::operator==(&this->raw_message,&other->raw_message);
    return _Var1;
  }
  return false;
}

Assistant:

bool ErrorData::operator==(const ErrorData &other) const {
	if (initialized != other.initialized) {
		return false;
	}
	if (type != other.type) {
		return false;
	}
	return raw_message == other.raw_message;
}